

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<256,_256>::~ObjectBlockPool(ObjectBlockPool<256,_256> *this)

{
  Reset(this);
  FastVector<SmallBlock<256>_*,_false,_false>::~FastVector(&this->objectsToFree);
  FastVector<SmallBlock<256>_*,_false,_false>::~FastVector(&this->objectsToFinalize);
  FastVector<LargeBlock<256,_256>_*,_false,_false>::~FastVector(&this->sortedPages);
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}